

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

cram_codec *
cram_encoder_init(cram_encoding codec,cram_stats *st,cram_external_type option,void *dat,int version
                 )

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  cram_codec *pcVar5;
  void *pvVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  size_t __size;
  size_t sVar12;
  undefined4 in_register_0000003c;
  long *plVar13;
  long lVar14;
  undefined4 in_register_00000084;
  int *piVar15;
  long lVar16;
  long lVar17;
  char *__src;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  
  piVar15 = (int *)CONCAT44(in_register_00000084,version);
  plVar13 = (long *)CONCAT44(in_register_0000003c,codec);
  if ((st != (cram_stats *)0x0) && (st->nvals == 0)) {
    return (cram_codec *)0x0;
  }
  if ((0x385UL >> ((ulong)codec & 0x3f) & 1) == 0) {
    pcVar5 = (*encode_init[codec])(st,option,dat,version);
    if (pcVar5 == (cram_codec *)0x0) {
      return (cram_codec *)0x0;
    }
    pcVar5->out = (cram_block *)0x0;
    return pcVar5;
  }
  cram_encoder_init_cold_1();
  if (plVar13[3] == 0) {
    uVar3 = *(uint *)(*plVar13 + 0x20);
    if ((int)uVar3 < 1) {
      uVar8 = 0;
      lVar17 = 0;
    }
    else {
      uVar8 = 0;
      do {
        lVar17 = *(long *)(plVar13[2] + uVar8 * 8);
        if (((lVar17 != 0) && (*(int *)(lVar17 + 8) == 4)) &&
           (*(int *)(lVar17 + 0xc) == st->freqs[0xd])) goto LAB_00144ff9;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      uVar8 = (ulong)uVar3;
    }
LAB_00144ff9:
    if ((uint)uVar8 == uVar3) {
      return (cram_codec *)0xffffffff;
    }
    if (lVar17 == 0) {
      return (cram_codec *)0xffffffff;
    }
  }
  else {
    lVar17 = *(long *)(plVar13[3] + (long)st->freqs[0xd] * 8);
    if (lVar17 == 0) {
      return (cram_codec *)(ulong)-(uint)(*piVar15 != 0);
    }
  }
  iVar9 = *(int *)(lVar17 + 0x1c);
  uVar8 = (ulong)iVar9;
  iVar4 = *(int *)(lVar17 + 0x14);
  pcVar5 = (cram_codec *)0xffffffff;
  if (iVar9 < iVar4) {
    __src = (char *)(*(long *)(lVar17 + 0x20) + uVar8);
    cVar2 = (char)st->freqs[0xc];
    uVar11 = (long)iVar4 - uVar8;
    if (uVar11 < (ulong)(*(long *)((long)dat + 0x28) - *(long *)((long)dat + 0x30))) {
      cVar10 = *__src;
      pcVar7 = (char *)(*(long *)((long)dat + 0x30) + *(long *)((long)dat + 0x20));
      if (iVar9 != iVar4 && cVar10 != cVar2) {
        lVar16 = ~uVar8 + (long)iVar4;
        do {
          *pcVar7 = cVar10;
          pcVar7 = pcVar7 + 1;
          cVar10 = __src[1];
          __src = __src + 1;
          if (cVar10 == cVar2) break;
          bVar18 = lVar16 != 0;
          lVar16 = lVar16 + -1;
        } while (bVar18);
      }
      iVar9 = (int)__src;
      *(long *)((long)dat + 0x30) = (long)pcVar7 - *(long *)((long)dat + 0x20);
    }
    else {
      lVar16 = 2;
      sVar1 = 0;
      do {
        sVar12 = sVar1;
        sVar1 = sVar12 + 1;
        lVar16 = lVar16 + -2;
        if (__src[sVar12] == cVar2) break;
      } while (uVar11 != sVar12);
      uVar8 = *(ulong *)((long)dat + 0x28);
      lVar14 = *(long *)((long)dat + 0x30);
      if (uVar8 <= (lVar14 + sVar1) - 1) {
        do {
          auVar19._8_4_ = (int)(uVar8 >> 0x20);
          auVar19._0_8_ = uVar8;
          auVar19._12_4_ = 0x45300000;
          dVar21 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
          uVar11 = (ulong)dVar21;
          __size = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
          if (uVar8 == 0) {
            __size = 0x400;
          }
          *(size_t *)((long)dat + 0x28) = __size;
          pvVar6 = realloc(*(void **)((long)dat + 0x20),__size);
          *(void **)((long)dat + 0x20) = pvVar6;
          uVar8 = *(ulong *)((long)dat + 0x28);
          lVar14 = *(long *)((long)dat + 0x30);
        } while (uVar8 <= (lVar14 + sVar1) - 1);
      }
      iVar9 = (int)__src + (int)sVar1 + -1;
      memcpy((void *)(lVar14 + *(long *)((long)dat + 0x20)),__src,sVar12);
      uVar8 = *(ulong *)((long)dat + 0x28);
      lVar14 = *(long *)((long)dat + 0x30);
      *(size_t *)((long)dat + 0x30) = lVar14 + sVar1 + -1;
      if (uVar8 <= (ulong)(lVar14 - lVar16)) {
        do {
          auVar20._8_4_ = (int)(uVar8 >> 0x20);
          auVar20._0_8_ = uVar8;
          auVar20._12_4_ = 0x45300000;
          dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
          uVar11 = (ulong)dVar21;
          sVar12 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
          if (uVar8 == 0) {
            sVar12 = 0x400;
          }
          *(size_t *)((long)dat + 0x28) = sVar12;
          pvVar6 = realloc(*(void **)((long)dat + 0x20),sVar12);
          *(void **)((long)dat + 0x20) = pvVar6;
          uVar8 = *(ulong *)((long)dat + 0x28);
        } while (uVar8 <= (*(long *)((long)dat + 0x30) + sVar1) - 1);
      }
    }
    iVar4 = *(int *)(lVar17 + 0x20);
    *piVar15 = iVar9 - (*(int *)(lVar17 + 0x1c) + iVar4);
    *(int *)(lVar17 + 0x1c) = (iVar9 - iVar4) + 1;
    pcVar5 = (cram_codec *)0x0;
  }
  return pcVar5;
}

Assistant:

cram_codec *cram_encoder_init(enum cram_encoding codec,
			      cram_stats *st,
			      enum cram_external_type option,
			      void *dat,
			      int version) {
    if (st && !st->nvals)
	return NULL;

    if (encode_init[codec]) {
	cram_codec *r;
	if ((r = encode_init[codec](st, option, dat, version)))
	    r->out = NULL;
	return r;
    } else {
	fprintf(stderr, "Unimplemented codec of type %s\n", codec2str(codec));
	abort();
    }
}